

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynCallArgument * ParseCallArgument(ParseContext *ctx)

{
  uint uVar1;
  LexemeType LVar2;
  Lexeme *begin;
  int iVar3;
  undefined4 extraout_var;
  SynBase *pSVar4;
  undefined4 extraout_var_00;
  SynCallArgument *pSVar5;
  undefined4 extraout_var_02;
  Lexeme *begin_00;
  SynIdentifier *this;
  undefined4 extraout_var_01;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_string) {
    pSVar5 = (SynCallArgument *)begin->pos;
    uVar1 = begin->length;
    ctx->currentLexeme = begin + 1;
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    this = (SynIdentifier *)CONCAT44(extraout_var,iVar3);
    if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_001158f0;
    begin_00 = ctx->currentLexeme + -1;
    SynBase::SynBase((SynBase *)this,4,begin_00,begin_00);
    (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002470a0;
    (this->name).begin = (char *)pSVar5;
    (this->name).end = (char *)((long)&(pSVar5->super_SynBase)._vptr_SynBase + (ulong)uVar1);
    LVar2 = ctx->currentLexeme->type;
    if (LVar2 == lex_colon) {
      ctx->currentLexeme = ctx->currentLexeme + 1;
      pSVar4 = ParseAssignment(ctx);
      if (pSVar4 == (SynBase *)0x0) {
        anon_unknown.dwarf_15703::Report
                  (ctx,ctx->currentLexeme,
                   "ERROR: expression not found after \':\' in function argument list");
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])();
        pSVar4 = (SynBase *)CONCAT44(extraout_var_00,iVar3);
        SynBase::SynBase(pSVar4,0,ctx->currentLexeme,ctx->currentLexeme);
        pSVar4->_vptr_SynBase = (_func_int **)&PTR__SynBase_002471e8;
      }
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pSVar5 = (SynCallArgument *)CONCAT44(extraout_var_01,iVar3);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_001158f0;
      SynBase::SynBase((SynBase *)pSVar5,0x18,begin,ctx->currentLexeme + -1);
      (pSVar5->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002474f8;
      pSVar5->name = this;
      pSVar5->value = pSVar4;
    }
    else {
      ctx->currentLexeme = begin;
    }
    if (LVar2 == lex_colon) {
      return pSVar5;
    }
  }
  pSVar4 = ParseAssignment(ctx);
  if (pSVar4 == (SynBase *)0x0) {
    pSVar5 = (SynCallArgument *)0x0;
  }
  else {
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    pSVar5 = (SynCallArgument *)CONCAT44(extraout_var_02,iVar3);
    if (ctx->currentLexeme <= ctx->firstLexeme) {
LAB_001158f0:
      __assert_fail("currentLexeme > firstLexeme",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0x19c,"Lexeme *ParseContext::Previous()");
    }
    SynBase::SynBase((SynBase *)pSVar5,0x18,begin,ctx->currentLexeme + -1);
    (pSVar5->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002474f8;
    pSVar5->name = (SynIdentifier *)0x0;
    pSVar5->value = pSVar4;
  }
  return pSVar5;
}

Assistant:

SynCallArgument* ParseCallArgument(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.At(lex_string))
	{
		InplaceStr name = ctx.Consume();
		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);

		if(ctx.Consume(lex_colon))
		{
			SynBase *value = ParseAssignment(ctx);

			if(!value)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after ':' in function argument list");

				value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}

			return new (ctx.get<SynCallArgument>()) SynCallArgument(start, ctx.Previous(), nameIdentifier, value);
		}
		else
		{
			// Backtrack
			ctx.currentLexeme = start;
		}
	}

	if(SynBase *value = ParseAssignment(ctx))
	{
		return new (ctx.get<SynCallArgument>()) SynCallArgument(start, ctx.Previous(), NULL, value);
	}

	return NULL;
}